

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v_palette.cpp
# Opt level: O0

void InitPalette(void)

{
  int iVar1;
  undefined1 local_348 [8];
  FWadLump palump;
  int lump;
  bool usingBuild;
  BYTE pal [768];
  
  palump.Lump._7_1_ = 0;
  palump.Lump._0_4_ = FWadCollection::CheckNumForFullName(&Wads,"palette.dat",false,0);
  if (((int)palump.Lump < 0) ||
     (iVar1 = FWadCollection::LumpLength(&Wads,(int)palump.Lump), iVar1 < 0x300)) {
    palump.Lump._0_4_ = FWadCollection::CheckNumForFullName(&Wads,"blood.pal",false,0);
    if ((-1 < (int)palump.Lump) &&
       (iVar1 = FWadCollection::LumpLength(&Wads,(int)palump.Lump), 0x2ff < iVar1)) {
      palump.Lump._7_1_ = FixBuildPalette((BYTE *)&lump,(int)palump.Lump,true);
    }
  }
  else {
    palump.Lump._7_1_ = FixBuildPalette((BYTE *)&lump,(int)palump.Lump,false);
  }
  if ((palump.Lump._7_1_ & 1) == 0) {
    FWadCollection::OpenLumpName((FWadLump *)local_348,&Wads,"PLAYPAL");
    FWadLump::Read((FWadLump *)local_348,&lump,0x300);
    FWadLump::~FWadLump((FWadLump *)local_348);
  }
  FPalette::SetPalette(&GPalette,(BYTE *)&lump);
  FPalette::MakeGoodRemap(&GPalette);
  FColorMatcher::SetPalette(&ColorMatcher,(DWORD *)&GPalette);
  if (((palump.Lump._7_1_ & 1) == 0) && (GPalette.Remap[0] == '\0')) {
    iVar1 = BestColor((uint32 *)&GPalette,(uint)GPalette.BaseColors[0].field_0.field_0.r,
                      (uint)GPalette.BaseColors[0].field_0.field_0.g,
                      (uint)GPalette.BaseColors[0].field_0.field_0.b,1,0xff);
    GPalette.Remap[0] = (BYTE)iVar1;
  }
  R_InitColormaps();
  return;
}

Assistant:

void InitPalette ()
{
	BYTE pal[768];
	bool usingBuild = false;
	int lump;

	if ((lump = Wads.CheckNumForFullName ("palette.dat")) >= 0 && Wads.LumpLength (lump) >= 768)
	{
		usingBuild = FixBuildPalette (pal, lump, false);
	}
	else if ((lump = Wads.CheckNumForFullName ("blood.pal")) >= 0 && Wads.LumpLength (lump) >= 768)
	{
		usingBuild = FixBuildPalette (pal, lump, true);
	}

	if (!usingBuild)
	{
		FWadLump palump = Wads.OpenLumpName ("PLAYPAL");
		palump.Read (pal, 768);
	}

	GPalette.SetPalette (pal);
	GPalette.MakeGoodRemap ();
	ColorMatcher.SetPalette ((DWORD *)GPalette.BaseColors);

	// The BUILD engine already has a transparent color, so it doesn't need any remapping.
	if (!usingBuild)
	{
		if (GPalette.Remap[0] == 0)
		{ // No duplicates, so settle for something close to color 0
			GPalette.Remap[0] = BestColor ((DWORD *)GPalette.BaseColors,
				GPalette.BaseColors[0].r, GPalette.BaseColors[0].g, GPalette.BaseColors[0].b, 1, 255);
		}
	}

	// Colormaps have to be initialized before actors are loaded,
	// otherwise Powerup.Colormap will not work.
	R_InitColormaps ();
}